

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void idct8x8_low1_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  undefined1 auVar5 [16];
  uint uVar10;
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  
  iVar2 = 1 << ((char)bit - 1U & 0x1f);
  iVar3 = bd + 6 + (uint)(do_cols == 0) * 2;
  iVar12 = 0x8000;
  if (0xf < iVar3) {
    iVar12 = 1 << ((char)iVar3 - 1U & 0x1f);
  }
  auVar11 = ZEXT416((uint)bit);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + (long)bit * 0x100 + 0x1e0);
  auVar5._4_4_ = uVar1;
  auVar5._0_4_ = uVar1;
  auVar5._8_4_ = uVar1;
  auVar5._12_4_ = uVar1;
  auVar5 = pmulld(auVar5,(undefined1  [16])*in);
  iVar3 = auVar5._0_4_ + iVar2 >> auVar11;
  iVar6 = auVar5._4_4_ + iVar2 >> auVar11;
  iVar8 = auVar5._8_4_ + iVar2 >> auVar11;
  iVar2 = auVar5._12_4_ + iVar2 >> auVar11;
  if (do_cols == 0) {
    iVar12 = 10;
    if (10 < bd) {
      iVar12 = bd;
    }
    iVar12 = 0x20 << ((byte)iVar12 & 0x1f);
    iVar13 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    auVar5 = ZEXT416((uint)out_shift);
    iVar3 = iVar3 + iVar13 >> auVar5;
    iVar6 = iVar6 + iVar13 >> auVar5;
    iVar8 = iVar8 + iVar13 >> auVar5;
    iVar2 = iVar2 + iVar13 >> auVar5;
  }
  iVar13 = iVar12 + -1;
  iVar12 = -iVar12;
  uVar4 = (uint)(iVar3 < iVar12) * iVar12 | (uint)(iVar3 >= iVar12) * iVar3;
  uVar7 = (uint)(iVar6 < iVar12) * iVar12 | (uint)(iVar6 >= iVar12) * iVar6;
  uVar9 = (uint)(iVar8 < iVar12) * iVar12 | (uint)(iVar8 >= iVar12) * iVar8;
  uVar10 = (uint)(iVar2 < iVar12) * iVar12 | (uint)(iVar2 >= iVar12) * iVar2;
  uVar4 = (uint)(iVar13 < (int)uVar4) * iVar13 | (iVar13 >= (int)uVar4) * uVar4;
  uVar7 = (uint)(iVar13 < (int)uVar7) * iVar13 | (iVar13 >= (int)uVar7) * uVar7;
  uVar9 = (uint)(iVar13 < (int)uVar9) * iVar13 | (iVar13 >= (int)uVar9) * uVar9;
  uVar10 = (uint)(iVar13 < (int)uVar10) * iVar13 | (iVar13 >= (int)uVar10) * uVar10;
  *(uint *)*out = uVar4;
  *(uint *)((long)*out + 4) = uVar7;
  *(uint *)(*out + 1) = uVar9;
  *(uint *)((long)*out + 0xc) = uVar10;
  *(uint *)out[1] = uVar4;
  *(uint *)((long)out[1] + 4) = uVar7;
  *(uint *)(out[1] + 1) = uVar9;
  *(uint *)((long)out[1] + 0xc) = uVar10;
  *(uint *)out[2] = uVar4;
  *(uint *)((long)out[2] + 4) = uVar7;
  *(uint *)(out[2] + 1) = uVar9;
  *(uint *)((long)out[2] + 0xc) = uVar10;
  *(uint *)out[3] = uVar4;
  *(uint *)((long)out[3] + 4) = uVar7;
  *(uint *)(out[3] + 1) = uVar9;
  *(uint *)((long)out[3] + 0xc) = uVar10;
  *(uint *)out[4] = uVar4;
  *(uint *)((long)out[4] + 4) = uVar7;
  *(uint *)(out[4] + 1) = uVar9;
  *(uint *)((long)out[4] + 0xc) = uVar10;
  *(uint *)out[5] = uVar4;
  *(uint *)((long)out[5] + 4) = uVar7;
  *(uint *)(out[5] + 1) = uVar9;
  *(uint *)((long)out[5] + 0xc) = uVar10;
  *(uint *)out[6] = uVar4;
  *(uint *)((long)out[6] + 4) = uVar7;
  *(uint *)(out[6] + 1) = uVar9;
  *(uint *)((long)out[6] + 0xc) = uVar10;
  *(uint *)out[7] = uVar4;
  *(uint *)((long)out[7] + 4) = uVar7;
  *(uint *)(out[7] + 1) = uVar9;
  *(uint *)((long)out[7] + 0xc) = uVar10;
  return;
}

Assistant:

static void idct8x8_low1_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                                int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i x;

  // stage 0
  // stage 1
  // stage 2
  // stage 3
  x = _mm_mullo_epi32(in[0], cospi32);
  x = _mm_add_epi32(x, rnding);
  x = _mm_srai_epi32(x, bit);

  // stage 4
  // stage 5
  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    clamp_lo = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    clamp_hi = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    __m128i offset = _mm_set1_epi32((1 << out_shift) >> 1);
    x = _mm_add_epi32(x, offset);
    x = _mm_sra_epi32(x, _mm_cvtsi32_si128(out_shift));
  }

  x = _mm_max_epi32(x, clamp_lo);
  x = _mm_min_epi32(x, clamp_hi);
  out[0] = x;
  out[1] = x;
  out[2] = x;
  out[3] = x;
  out[4] = x;
  out[5] = x;
  out[6] = x;
  out[7] = x;
}